

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::getMessageTarget
          (RpcConnectionState *this,Reader *target)

{
  Reader ops_00;
  Which WVar1;
  uint32_t uVar2;
  ClientHook *pCVar3;
  PipelineHook *pPVar4;
  NullableValue<kj::Array<capnp::PipelineOp>_> *other;
  Array<capnp::PipelineOp> *pAVar5;
  char (*params) [80];
  Export *in_RDX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ArrayPtr<const_capnp::PipelineOp> AVar6;
  Maybe<kj::Own<capnp::ClientHook>_> MVar7;
  undefined8 in_stack_fffffffffffffc88;
  Own<capnp::ClientHook> *t;
  Fault local_2e0;
  Fault f_2;
  Own<capnp::ClientHook> local_2c8;
  Reader local_2b8;
  Maybe<kj::Array<capnp::PipelineOp>_> local_288;
  undefined1 local_268 [8];
  NullableValue<kj::Array<capnp::PipelineOp>_> ops;
  Exception local_230;
  Own<capnp::PipelineHook> local_d8;
  Own<capnp::PipelineHook> local_c8;
  Own<capnp::PipelineHook> *local_b8;
  Own<capnp::PipelineHook> *p;
  Fault local_a8;
  Fault f_1;
  Answer *base;
  Own<capnp::PipelineHook> pipeline;
  Reader promisedAnswer;
  Fault local_48;
  Fault f;
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Export_&> local_30;
  Export *local_28;
  Export *exp;
  Reader *target_local;
  RpcConnectionState *this_local;
  
  exp = in_RDX;
  target_local = target;
  this_local = this;
  WVar1 = rpc::MessageTarget::Reader::which((Reader *)in_RDX);
  params = (char (*) [80])(ulong)WVar1;
  if (WVar1 == IMPORTED_CAP) {
    uVar2 = rpc::MessageTarget::Reader::getImportedCap((Reader *)exp);
    local_30 = ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Export>
               ::find((ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Export>
                       *)&target[9]._reader.capTable,uVar2);
    local_28 = kj::_::readMaybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Export>
                         (&local_30);
    if (local_28 == (Export *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x986,FAILED,(char *)0x0,"\"Message target is not a current export ID.\"",
                 (char (*) [43])"Message target is not a current export ID.");
      kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe
                ((Maybe<kj::Own<capnp::ClientHook>_> *)this,(void *)0x0);
      kj::_::Debug::Fault::~Fault(&local_48);
      pCVar3 = extraout_RDX_00;
    }
    else {
      pCVar3 = kj::Own<capnp::ClientHook>::operator->(&local_28->clientHook);
      (*pCVar3->_vptr_ClientHook[4])(&f);
      kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe
                ((Maybe<kj::Own<capnp::ClientHook>_> *)this,(Own<capnp::ClientHook> *)&f);
      kj::Own<capnp::ClientHook>::~Own((Own<capnp::ClientHook> *)&f);
      pCVar3 = extraout_RDX;
    }
  }
  else if (WVar1 == PROMISED_ANSWER) {
    rpc::MessageTarget::Reader::getPromisedAnswer((Reader *)&pipeline.ptr,(Reader *)exp);
    kj::Own<capnp::PipelineHook>::Own((Own<capnp::PipelineHook> *)&base);
    uVar2 = rpc::PromisedAnswer::Reader::getQuestionId((Reader *)&pipeline.ptr);
    f_1.exception =
         (Exception *)
         ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>::
         operator[]((ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                     *)&target[0xb]._reader.nestingLimit,uVar2);
    if (((ulong)((f_1.exception)->ownFile).content.ptr & 1) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
                (&local_a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x992,FAILED,"base.active",
                 "\"PromisedAnswer.questionId is not a current question.\"",
                 (char (*) [53])"PromisedAnswer.questionId is not a current question.");
      kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe
                ((Maybe<kj::Own<capnp::ClientHook>_> *)this,(void *)0x0);
      p._4_4_ = 1;
      kj::_::Debug::Fault::~Fault(&local_a8);
    }
    else {
      local_b8 = kj::_::readMaybe<capnp::PipelineHook>
                           ((Maybe<kj::Own<capnp::PipelineHook>_> *)
                            &((f_1.exception)->ownFile).content.size_);
      if (local_b8 == (Own<capnp::PipelineHook> *)0x0) {
        kj::_::Debug::makeDescription<char_const(&)[80]>
                  ((String *)((long)&ops.field_1 + 0x10),
                   (Debug *)
                   "\"Pipeline call on a request that returned no capabilities or was already closed.\""
                   ,
                   "Pipeline call on a request that returned no capabilities or was already closed."
                   ,params);
        kj::Exception::Exception
                  (&local_230,FAILED,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x999,(String *)((long)&ops.field_1 + 0x10));
        newBrokenPipeline((capnp *)&local_d8,&local_230);
        kj::Own<capnp::PipelineHook>::operator=((Own<capnp::PipelineHook> *)&base,&local_d8);
        kj::Own<capnp::PipelineHook>::~Own(&local_d8);
        kj::Exception::~Exception(&local_230);
        kj::String::~String((String *)((long)&ops.field_1 + 0x10));
      }
      else {
        pPVar4 = kj::Own<capnp::PipelineHook>::get(local_b8);
        (**pPVar4->_vptr_PipelineHook)(&local_c8);
        kj::Own<capnp::PipelineHook>::operator=((Own<capnp::PipelineHook> *)&base,&local_c8);
        kj::Own<capnp::PipelineHook>::~Own(&local_c8);
      }
      rpc::PromisedAnswer::Reader::getTransform(&local_2b8,(Reader *)&pipeline.ptr);
      ops_00.reader.capTable = (CapTableReader *)local_2b8.reader.ptr;
      ops_00.reader.segment = (SegmentReader *)local_2b8.reader.capTable;
      ops_00.reader.ptr = (byte *)local_2b8.reader._24_8_;
      ops_00.reader._24_8_ = local_2b8.reader._32_8_;
      ops_00.reader.structDataSize = local_2b8.reader.nestingLimit;
      ops_00.reader.structPointerCount = local_2b8.reader._44_2_;
      ops_00.reader.elementSize = local_2b8.reader._46_1_;
      ops_00.reader._39_1_ = local_2b8.reader._47_1_;
      ops_00.reader._40_8_ = in_stack_fffffffffffffc88;
      toPipelineOps(ops_00);
      other = kj::_::readMaybe<kj::Array<capnp::PipelineOp>>(&local_288);
      kj::_::NullableValue<kj::Array<capnp::PipelineOp>_>::NullableValue
                ((NullableValue<kj::Array<capnp::PipelineOp>_> *)local_268,other);
      kj::Maybe<kj::Array<capnp::PipelineOp>_>::~Maybe(&local_288);
      pAVar5 = kj::_::NullableValue::operator_cast_to_Array_((NullableValue *)local_268);
      if (pAVar5 == (Array<capnp::PipelineOp> *)0x0) {
        kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe
                  ((Maybe<kj::Own<capnp::ClientHook>_> *)this,(void *)0x0);
      }
      else {
        pPVar4 = kj::Own<capnp::PipelineHook>::operator->((Own<capnp::PipelineHook> *)&base);
        pAVar5 = kj::_::NullableValue<kj::Array<capnp::PipelineOp>_>::operator*
                           ((NullableValue<kj::Array<capnp::PipelineOp>_> *)local_268);
        AVar6 = kj::Array::operator_cast_to_ArrayPtr((Array *)pAVar5);
        f_2.exception = (Exception *)AVar6.ptr;
        (*pPVar4->_vptr_PipelineHook[1])(&local_2c8,pPVar4,f_2.exception,AVar6.size_);
        t = &local_2c8;
        kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe((Maybe<kj::Own<capnp::ClientHook>_> *)this,t);
        kj::Own<capnp::ClientHook>::~Own(t);
      }
      p._4_4_ = 1;
      kj::_::NullableValue<kj::Array<capnp::PipelineOp>_>::~NullableValue
                ((NullableValue<kj::Array<capnp::PipelineOp>_> *)local_268);
    }
    kj::Own<capnp::PipelineHook>::~Own((Own<capnp::PipelineHook> *)&base);
    pCVar3 = extraout_RDX_01;
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,char_const(&)[29],capnp::rpc::MessageTarget::Reader_const&>
              (&local_2e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x9a5,FAILED,(char *)0x0,"\"Unknown message target type.\", target",
               (char (*) [29])"Unknown message target type.",(Reader *)exp);
    kj::Maybe<kj::Own<capnp::ClientHook>_>::Maybe
              ((Maybe<kj::Own<capnp::ClientHook>_> *)this,(void *)0x0);
    p._4_4_ = 1;
    kj::_::Debug::Fault::~Fault(&local_2e0);
    pCVar3 = extraout_RDX_02;
  }
  MVar7.ptr.ptr = pCVar3;
  MVar7.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar7.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> getMessageTarget(const rpc::MessageTarget::Reader& target) {
    switch (target.which()) {
      case rpc::MessageTarget::IMPORTED_CAP: {
        KJ_IF_MAYBE(exp, exports.find(target.getImportedCap())) {
          return exp->clientHook->addRef();
        } else {
          KJ_FAIL_REQUIRE("Message target is not a current export ID.") {
            return nullptr;
          }
        }
        break;
      }